

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

int __thiscall
smf::MidiFile::extractMidiData
          (MidiFile *this,istream *input,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *array,uchar *runningCommand)

{
  pointer *ppuVar1;
  pointer puVar2;
  long lVar3;
  iterator iVar4;
  bool bVar5;
  uchar uVar6;
  uchar uVar7;
  int iVar8;
  uint extraout_EAX;
  uint extraout_EAX_00;
  uint extraout_EAX_01;
  undefined8 in_RAX;
  long *plVar9;
  undefined8 uVar10;
  undefined7 extraout_var_00;
  ostream *poVar11;
  byte bVar12;
  uint uVar13;
  long lVar14;
  char *pcVar15;
  uchar d;
  uint uVar16;
  ulong uVar17;
  uchar byte1;
  uchar byte2;
  uchar byte3;
  uchar byte4;
  undefined8 uStack_38;
  undefined7 extraout_var;
  
  puVar2 = (array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  uStack_38 = in_RAX;
  iVar8 = std::istream::get();
  if (iVar8 == -1) {
    pcVar15 = "Error: unexpected end of file.";
    lVar14 = 0x1e;
LAB_00114baf:
    plVar9 = &std::cerr;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar15,lVar14);
    lVar14 = std::cerr;
LAB_00114bba:
    std::ios::widen((char)*(undefined8 *)(lVar14 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    std::ostream::flush();
    return 0;
  }
  uVar7 = (uchar)iVar8;
  uStack_38._0_4_ = CONCAT13(uVar7,(undefined3)uStack_38);
  if ((char)uVar7 < '\0') {
    *runningCommand = uVar7;
  }
  else {
    if (*runningCommand == 0) {
      pcVar15 = "Error: running command with no previous command";
      lVar14 = 0x2f;
      goto LAB_00114baf;
    }
    if (0xef < *runningCommand) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error: running status not permitted with meta and sysex",
                 0x37);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," event.",7);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Byte is 0x",10);
      *(uint *)(__cxa_finalize + *(long *)(std::cerr + -0x18)) =
           *(uint *)(__cxa_finalize + *(long *)(std::cerr + -0x18)) & 0xffffffb5 | 8;
      plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cerr,(uint)uStack_38._3_1_);
      lVar14 = *plVar9;
      lVar3 = *(long *)(lVar14 + -0x18);
      *(uint *)((long)plVar9 + lVar3 + 0x18) =
           *(uint *)((long)plVar9 + lVar3 + 0x18) & 0xffffffb5 | 2;
      goto LAB_00114bba;
    }
  }
  iVar4._M_current =
       (array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_realloc_insert<unsigned_char_const&>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)array,iVar4,runningCommand);
  }
  else {
    *iVar4._M_current = *runningCommand;
    ppuVar1 = &(array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  if (-1 < (char)uVar7) {
    iVar4._M_current =
         (array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)array,iVar4,
                 (uchar *)((long)&uStack_38 + 3));
    }
    else {
      *iVar4._M_current = uStack_38._3_1_;
      ppuVar1 = &(array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
  }
  bVar12 = *runningCommand;
  uVar13 = bVar12 - 0x80 >> 4;
  if (7 < uVar13) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error reading midifile",0x16);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Command byte was ",0x11);
    plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cout,(uint)*runningCommand);
    lVar14 = *plVar9;
    goto LAB_00114bba;
  }
  if ((0x4fU >> (uVar13 & 0x1f) & 1) == 0) {
    if ((0x30U >> (uVar13 & 0x1f) & 1) == 0) {
      if ((bVar12 == 0xf0) || (bVar12 == 0xf7)) {
        uVar17 = readVLValue(this,input);
        uVar16 = (uint)uVar17;
        bVar5 = 0 < (int)uVar16;
        uVar13 = uVar16;
        if (0 < (int)uVar16) {
          uVar7 = readByte(this,input);
          uVar10 = CONCAT71(extraout_var,uVar7);
          uStack_38._0_4_ = CONCAT13(uVar7,(undefined3)uStack_38);
          bVar12 = this->m_rwstatus;
          if ((bool)bVar12 == true) {
            iVar8 = 0;
            do {
              uVar13 = (uint)uVar10;
              iVar4._M_current =
                   (array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  (array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                  .super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_char,std::allocator<unsigned_char>>::
                _M_realloc_insert<unsigned_char_const&>
                          ((vector<unsigned_char,std::allocator<unsigned_char>> *)array,iVar4,
                           (uchar *)((long)&uStack_38 + 3));
                uVar13 = extraout_EAX_01;
              }
              else {
                *iVar4._M_current = (uchar)uVar10;
                ppuVar1 = &(array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *ppuVar1 = *ppuVar1 + 1;
              }
              if (uVar16 - 1 == iVar8) {
                bVar5 = false;
                goto LAB_00114f1e;
              }
              uVar7 = readByte(this,input);
              uVar10 = CONCAT71(extraout_var_00,uVar7);
              uStack_38._0_4_ = CONCAT13(uVar7,(undefined3)uStack_38);
              iVar8 = iVar8 + 1;
            } while (this->m_rwstatus != false);
            bVar5 = iVar8 < (int)uVar16;
            bVar12 = 0;
          }
          uVar13 = (uint)bVar12;
        }
LAB_00114f1e:
        if (!bVar5) {
          return 1;
        }
        return uVar13;
      }
      if (bVar12 != 0xff) {
        return 1;
      }
      if ((char)uVar7 < '\0') {
        uVar7 = readByte(this,input);
        uStack_38._0_4_ = CONCAT13(uVar7,(undefined3)uStack_38);
        if (this->m_rwstatus == false) {
          return 0;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  (array,(value_type_conflict2 *)((long)&uStack_38 + 3));
      }
      uStack_38._0_5_ = (uint5)uStack_38 & 0xffffffff;
      uStack_38 = (ulong)(uint5)uStack_38;
      uVar7 = readByte(this,input);
      uStack_38._0_5_ = CONCAT14(uVar7,(undefined4)uStack_38);
      uVar13 = (uint)this->m_rwstatus;
      if (this->m_rwstatus == false) {
LAB_0011501d:
        bVar5 = false;
      }
      else {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  (array,(value_type_conflict2 *)((long)&uStack_38 + 4));
        uVar17 = (ulong)(char)uStack_38._4_1_;
        uVar16 = extraout_EAX;
        if ((long)uVar17 < 0) {
          uVar7 = readByte(this,input);
          uStack_38._0_6_ = CONCAT15(uVar7,(uint5)uStack_38);
          uVar13 = (uint)this->m_rwstatus;
          if (this->m_rwstatus == false) goto LAB_0011501d;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    (array,(value_type_conflict2 *)((long)&uStack_38 + 5));
          if (uStack_38._5_1_ < 0x81) {
            uVar7 = '\0';
LAB_00114fb5:
            uVar6 = uStack_38._4_1_;
            bVar12 = uStack_38._5_1_;
            d = '\0';
          }
          else {
            uVar7 = readByte(this,input);
            uStack_38._0_7_ = CONCAT16(uVar7,(undefined6)uStack_38);
            uVar13 = (uint)this->m_rwstatus;
            if (this->m_rwstatus == false) goto LAB_0011501d;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                      (array,(value_type_conflict2 *)((long)&uStack_38 + 6));
            if (-1 < (char)uStack_38._6_1_) {
              uVar7 = uStack_38._6_1_;
              goto LAB_00114fb5;
            }
            uVar7 = readByte(this,input);
            uStack_38 = CONCAT17(uVar7,(undefined7)uStack_38);
            uVar13 = (uint)this->m_rwstatus;
            if (this->m_rwstatus == false) goto LAB_0011501d;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                      (array,(value_type_conflict2 *)((long)&uStack_38 + 7));
            if ((long)uStack_38 < 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Error: cannot handle large VLVs",0x1f);
              std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
              this->m_rwstatus = false;
              bVar5 = false;
              uVar13 = 0;
              goto LAB_0011501f;
            }
            uVar6 = uStack_38._4_1_;
            bVar12 = uStack_38._5_1_;
            uVar7 = uStack_38._6_1_;
            d = uStack_38._7_1_;
          }
          bVar5 = false;
          uVar17 = unpackVLV(this,uVar6,bVar12,uVar7,d,'\0');
          uVar13 = 0;
          uVar16 = 0;
          if (this->m_rwstatus == false) goto LAB_0011501f;
        }
        uVar13 = uVar16;
        bVar5 = (int)uVar17 < 1;
        if (0 < (int)uVar17) {
          do {
            uVar7 = readByte(this,input);
            uStack_38._0_4_ = CONCAT13(uVar7,(undefined3)uStack_38);
            bVar5 = this->m_rwstatus;
            uVar13 = (uint)bVar5;
            if (bVar5 == false) goto LAB_0011501d;
            iVar4._M_current =
                 (array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_char,std::allocator<unsigned_char>>::
              _M_realloc_insert<unsigned_char_const&>
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)array,iVar4,
                         (uchar *)((long)&uStack_38 + 3));
              uVar13 = extraout_EAX_00;
            }
            else {
              *iVar4._M_current = uVar7;
              ppuVar1 = &(array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Vector_impl_data._M_finish;
              *ppuVar1 = *ppuVar1 + 1;
              uVar13 = (uint)bVar5;
            }
            uVar16 = (int)uVar17 - 1;
            uVar17 = (ulong)uVar16;
          } while (uVar16 != 0);
          bVar5 = true;
        }
      }
LAB_0011501f:
      if (bVar5) {
        return 1;
      }
      return uVar13;
    }
  }
  else {
    uVar6 = readByte(this,input);
    uStack_38._0_4_ = CONCAT13(uVar6,(undefined3)uStack_38);
    if (this->m_rwstatus == false) {
      return 0;
    }
    if ((char)uVar6 < '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"MIDI data byte too large: ",0x1a);
      plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cerr,(uint)uStack_38._3_1_);
      std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
      std::ostream::put((char)plVar9);
      std::ostream::flush();
      goto LAB_00114f13;
    }
    iVar4._M_current =
         (array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)array,iVar4,
                 (uchar *)((long)&uStack_38 + 3));
    }
    else {
      *iVar4._M_current = uVar6;
      ppuVar1 = &(array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
  }
  if (-1 < (char)uVar7) {
    return 1;
  }
  uVar7 = readByte(this,input);
  uStack_38._0_4_ = CONCAT13(uVar7,(undefined3)uStack_38);
  if (this->m_rwstatus == false) {
    return 0;
  }
  if (-1 < (char)uVar7) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (array,(value_type_conflict2 *)((long)&uStack_38 + 3));
    return 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"MIDI data byte too large: ",0x1a);
  poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(uint)uStack_38._3_1_);
  std::endl<char,std::char_traits<char>>(poVar11);
LAB_00114f13:
  this->m_rwstatus = false;
  return 0;
}

Assistant:

int MidiFile::extractMidiData(std::istream& input, std::vector<uchar>& array,
	uchar& runningCommand) {

	int character;
	uchar byte;
	array.clear();
	int runningQ;

	character = input.get();
	if (character == EOF) {
		std::cerr << "Error: unexpected end of file." << std::endl;
		return 0;
	} else {
		byte = (uchar)character;
	}

	if (byte < 0x80) {
		runningQ = 1;
		if (runningCommand == 0) {
			std::cerr << "Error: running command with no previous command" << std::endl;
			return 0;
		}
		if (runningCommand >= 0xf0) {
			std::cerr << "Error: running status not permitted with meta and sysex"
			     << " event." << std::endl;
			std::cerr << "Byte is 0x" << std::hex << (int)byte << std::dec << std::endl;
			return 0;
		}
	} else {
		runningCommand = byte;
		runningQ = 0;
	}

	array.push_back(runningCommand);
	if (runningQ) {
		array.push_back(byte);
	}

	switch (runningCommand & 0xf0) {
		case 0x80:        // note off (2 more bytes)
		case 0x90:        // note on (2 more bytes)
		case 0xA0:        // aftertouch (2 more bytes)
		case 0xB0:        // cont. controller (2 more bytes)
		case 0xE0:        // pitch wheel (2 more bytes)
			byte = readByte(input);
			if (!status()) { return m_rwstatus; }
			if (byte > 0x7f) {
				std::cerr << "MIDI data byte too large: " << (int)byte << std::endl;
				m_rwstatus = false; return m_rwstatus;
			}
			array.push_back(byte);
			if (!runningQ) {
				byte = readByte(input);
				if (!status()) { return m_rwstatus; }
				if (byte > 0x7f) {
					std::cerr << "MIDI data byte too large: " << (int)byte << std::endl;
					m_rwstatus = false; return m_rwstatus;
				}
				array.push_back(byte);
			}
			break;
		case 0xC0:        // patch change (1 more byte)
		case 0xD0:        // channel pressure (1 more byte)
			if (!runningQ) {
				byte = readByte(input);
				if (!status()) { return m_rwstatus; }
				if (byte > 0x7f) {
					std::cerr << "MIDI data byte too large: " << (int)byte << std::endl;
					m_rwstatus = false; return m_rwstatus;
				}
				array.push_back(byte);
			}
			break;
		case 0xF0:
			switch (runningCommand) {
				case 0xff:                 // meta event
					{
					if (!runningQ) {
						byte = readByte(input); // meta type
						if (!status()) { return m_rwstatus; }
						array.push_back(byte);
					}
					ulong length = 0;
					uchar byte1 = 0;
					uchar byte2 = 0;
					uchar byte3 = 0;
					uchar byte4 = 0;
					byte1 = readByte(input);
					if (!status()) { return m_rwstatus; }
					array.push_back(byte1);
					if (byte1 >= 0x80) {
						byte2 = readByte(input);
						if (!status()) { return m_rwstatus; }
						array.push_back(byte2);
						if (byte2 > 0x80) {
							byte3 = readByte(input);
							if (!status()) { return m_rwstatus; }
							array.push_back(byte3);
							if (byte3 >= 0x80) {
								byte4 = readByte(input);
								if (!status()) { return m_rwstatus; }
								array.push_back(byte4);
								if (byte4 >= 0x80) {
									std::cerr << "Error: cannot handle large VLVs" << std::endl;
									m_rwstatus = false; return m_rwstatus;
								} else {
									length = unpackVLV(byte1, byte2, byte3, byte4);
									if (!m_rwstatus) { return m_rwstatus; }
								}
							} else {
								length = unpackVLV(byte1, byte2, byte3);
								if (!m_rwstatus) { return m_rwstatus; }
							}
						} else {
							length = unpackVLV(byte1, byte2);
							if (!m_rwstatus) { return m_rwstatus; }
						}
					} else {
						length = byte1;
					}
					for (int j=0; j<(int)length; j++) {
						byte = readByte(input); // meta type
						if (!status()) { return m_rwstatus; }
						array.push_back(byte);
					}
					}
					break;

				// The 0xf0 and 0xf7 meta commands deal with system-exclusive
				// messages. 0xf0 is used to either start a message or to store
				// a complete message.  The 0xf0 is part of the outgoing MIDI
				// bytes.  The 0xf7 message is used to send arbitrary bytes,
				// typically the middle or ends of system exclusive messages.  The
				// 0xf7 byte at the start of the message is not part of the
				// outgoing raw MIDI bytes, but is kept in the MidiFile message
				// to indicate a raw MIDI byte message (typically a partial
				// system exclusive message).
				case 0xf7:   // Raw bytes. 0xf7 is not part of the raw
				             // bytes, but are included to indicate
				             // that this is a raw byte message.
				case 0xf0:   // System Exclusive message
					{         // (complete, or start of message).
					int length = (int)readVLValue(input);
					for (int i=0; i<length; i++) {
						byte = readByte(input);
						if (!status()) { return m_rwstatus; }
						array.push_back(byte);
					}
					}
					break;

				// other "F" MIDI commands are not expected, but can be
				// handled here if they exist.
			}
			break;
		default:
			std::cout << "Error reading midifile" << std::endl;
			std::cout << "Command byte was " << (int)runningCommand << std::endl;
			return 0;
	}
	return 1;
}